

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
* __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
::operator=(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
            *this,vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
                  *other)

{
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar1;
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar2;
  size_t sVar3;
  bool *pbVar4;
  long lVar5;
  size_t sVar6;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      poVar1 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = poVar1;
      sVar3 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar3;
      sVar3 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar3;
    }
    else {
      sVar3 = this->nStored;
      if (sVar3 != 0) {
        pbVar4 = &this->ptr->set;
        do {
          if (*pbVar4 == true) {
            *pbVar4 = false;
          }
          pbVar4 = pbVar4 + 0x18;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      this->nStored = 0;
      reserve(this,other->nStored);
      sVar3 = other->nStored;
      if (sVar3 != 0) {
        poVar1 = this->ptr;
        poVar2 = other->ptr;
        lVar5 = 0;
        sVar6 = sVar3;
        do {
          (&poVar1->set)[lVar5] = (&poVar2->set)[lVar5];
          if ((&poVar2->set)[lVar5] == true) {
            *(undefined8 *)((long)&poVar1->optionalValue + lVar5) = 0;
            *(undefined8 *)((long)&poVar1->optionalValue + lVar5) =
                 *(undefined8 *)((long)&poVar2->optionalValue + lVar5);
            *(undefined4 *)((long)&poVar1->optionalValue + lVar5 + 8) =
                 *(undefined4 *)((long)&poVar2->optionalValue + lVar5 + 8);
            (&poVar2->set)[lVar5] = false;
          }
          lVar5 = lVar5 + 0x18;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
      }
      this->nStored = sVar3;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }